

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  long entryPointLine;
  string commandName;
  string local_40;
  Snapshot local_20;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  if ((this->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    entryPointLine = 0;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_40);
    entryPointLine =
         (this->ContextStack).
         super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1]->Line;
  }
  cmState::CreateVariableScopeSnapshot
            (&local_20,this->GlobalGenerator->CMakeInstance->State,this->StateSnapshot,&local_40,
             entryPointLine);
  (this->StateSnapshot).Position.Position = local_20.Position.Position;
  (this->StateSnapshot).State = local_20.State;
  (this->StateSnapshot).Position.Tree = local_20.Position.Tree;
  PushLoopBlockBarrier(this);
  cmFileLockPool::PushFunctionScope(&this->GlobalGenerator->FileLockPool);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  std::string commandName;
  long line = 0;
  if (!this->ContextStack.empty())
    {
    commandName = this->ContextStack.back()->Name;
    line = this->ContextStack.back()->Line;
    }
  this->StateSnapshot = this->GetState()->CreateVariableScopeSnapshot(
        this->StateSnapshot,
        commandName,
        line);
  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}